

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  undefined1 local_248 [8];
  scale loaded_scale;
  ifstream local_220 [8];
  ifstream test_scale;
  char **param_1_local;
  int param_0_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,"scales/mixed.scl",8);
  scala::read_scl((scale *)local_248,local_220);
  sVar1 = scala::scale::get_scale_length((scale *)local_248);
  if (sVar1 != 3) {
    __assert_fail("loaded_scale.get_scale_length() == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x13,"int main(int, char **)");
  }
  dVar2 = scala::scale::get_ratio((scale *)local_248,0);
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    __assert_fail("loaded_scale.get_ratio(0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x14,"int main(int, char **)");
  }
  dVar2 = scala::scale::get_ratio((scale *)local_248,1);
  dVar3 = pow(2.0,0.16666666666666666);
  if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
    __assert_fail("loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                  ,0x15,"int main(int, char **)");
  }
  dVar2 = scala::scale::get_ratio((scale *)local_248,2);
  if ((dVar2 == 2.0) && (!NAN(dVar2))) {
    std::ifstream::close();
    scala::scale::~scale((scale *)local_248);
    std::ifstream::~ifstream(local_220);
    return 0;
  }
  __assert_fail("loaded_scale.get_ratio(2) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/MarkCWirt[P]libscala-file/tests/mixed.cpp"
                ,0x16,"int main(int, char **)");
}

Assistant:

int main(int, char**) {
    ifstream test_scale; 
    test_scale.open("scales/mixed.scl");
    scala::scale loaded_scale = scala::read_scl(test_scale);

    /*
       Load a scale that has both cents and ratios.
    */

    assert(loaded_scale.get_scale_length() == 3);                // Note that we add the first degree explicitly.
    assert(loaded_scale.get_ratio(0) == 1);                  // Implicit. It's always 1
    assert(loaded_scale.get_ratio(1) == pow(2.0, 1.0/6.0));  // 200 cents is the sixth root of 2 
    assert(loaded_scale.get_ratio(2) == 2);                  // Defined in scale as 2/1
    test_scale.close();
    return 0;
}